

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

int find_extensionsGLES2(void)

{
  int iVar1;
  char *in_stack_00000018;
  undefined4 local_4;
  
  iVar1 = get_exts();
  if (iVar1 != 0) {
    GLAD_GL_AMD_compressed_3DC_texture = has_ext(in_stack_00000018);
    GLAD_GL_AMD_compressed_ATC_texture = has_ext(in_stack_00000018);
    GLAD_GL_AMD_performance_monitor = has_ext(in_stack_00000018);
    GLAD_GL_AMD_program_binary_Z400 = has_ext(in_stack_00000018);
    GLAD_GL_ANDROID_extension_pack_es31a = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_depth_texture = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_framebuffer_blit = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_framebuffer_multisample = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_instanced_arrays = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_pack_reverse_row_order = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_program_binary = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_texture_compression_dxt3 = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_texture_compression_dxt5 = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_texture_usage = has_ext(in_stack_00000018);
    GLAD_GL_ANGLE_translated_shader_source = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_clip_distance = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_color_buffer_packed_float = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_copy_texture_levels = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_framebuffer_multisample = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_rgb_422 = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_sync = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_texture_max_level = has_ext(in_stack_00000018);
    GLAD_GL_APPLE_texture_packed_float = has_ext(in_stack_00000018);
    GLAD_GL_ARM_mali_program_binary = has_ext(in_stack_00000018);
    GLAD_GL_ARM_mali_shader_binary = has_ext(in_stack_00000018);
    GLAD_GL_ARM_rgba8 = has_ext(in_stack_00000018);
    GLAD_GL_ARM_shader_framebuffer_fetch = has_ext(in_stack_00000018);
    GLAD_GL_ARM_shader_framebuffer_fetch_depth_stencil = has_ext(in_stack_00000018);
    GLAD_GL_DMP_program_binary = has_ext(in_stack_00000018);
    GLAD_GL_DMP_shader_binary = has_ext(in_stack_00000018);
    GLAD_GL_EXT_EGL_image_array = has_ext(in_stack_00000018);
    GLAD_GL_EXT_YUV_target = has_ext(in_stack_00000018);
    GLAD_GL_EXT_base_instance = has_ext(in_stack_00000018);
    GLAD_GL_EXT_blend_func_extended = has_ext(in_stack_00000018);
    GLAD_GL_EXT_blend_minmax = has_ext(in_stack_00000018);
    GLAD_GL_EXT_buffer_storage = has_ext(in_stack_00000018);
    GLAD_GL_EXT_clear_texture = has_ext(in_stack_00000018);
    GLAD_GL_EXT_clip_cull_distance = has_ext(in_stack_00000018);
    GLAD_GL_EXT_color_buffer_float = has_ext(in_stack_00000018);
    GLAD_GL_EXT_color_buffer_half_float = has_ext(in_stack_00000018);
    GLAD_GL_EXT_conservative_depth = has_ext(in_stack_00000018);
    GLAD_GL_EXT_copy_image = has_ext(in_stack_00000018);
    GLAD_GL_EXT_debug_label = has_ext(in_stack_00000018);
    GLAD_GL_EXT_debug_marker = has_ext(in_stack_00000018);
    GLAD_GL_EXT_discard_framebuffer = has_ext(in_stack_00000018);
    GLAD_GL_EXT_disjoint_timer_query = has_ext(in_stack_00000018);
    GLAD_GL_EXT_draw_buffers = has_ext(in_stack_00000018);
    GLAD_GL_EXT_draw_buffers_indexed = has_ext(in_stack_00000018);
    GLAD_GL_EXT_draw_elements_base_vertex = has_ext(in_stack_00000018);
    GLAD_GL_EXT_draw_instanced = has_ext(in_stack_00000018);
    GLAD_GL_EXT_draw_transform_feedback = has_ext(in_stack_00000018);
    GLAD_GL_EXT_external_buffer = has_ext(in_stack_00000018);
    GLAD_GL_EXT_float_blend = has_ext(in_stack_00000018);
    GLAD_GL_EXT_geometry_point_size = has_ext(in_stack_00000018);
    GLAD_GL_EXT_geometry_shader = has_ext(in_stack_00000018);
    GLAD_GL_EXT_gpu_shader5 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_instanced_arrays = has_ext(in_stack_00000018);
    GLAD_GL_EXT_map_buffer_range = has_ext(in_stack_00000018);
    GLAD_GL_EXT_memory_object = has_ext(in_stack_00000018);
    GLAD_GL_EXT_memory_object_fd = has_ext(in_stack_00000018);
    GLAD_GL_EXT_memory_object_win32 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_multi_draw_arrays = has_ext(in_stack_00000018);
    GLAD_GL_EXT_multi_draw_indirect = has_ext(in_stack_00000018);
    GLAD_GL_EXT_multisampled_compatibility = has_ext(in_stack_00000018);
    GLAD_GL_EXT_multisampled_render_to_texture = has_ext(in_stack_00000018);
    GLAD_GL_EXT_multiview_draw_buffers = has_ext(in_stack_00000018);
    GLAD_GL_EXT_occlusion_query_boolean = has_ext(in_stack_00000018);
    GLAD_GL_EXT_polygon_offset_clamp = has_ext(in_stack_00000018);
    GLAD_GL_EXT_post_depth_coverage = has_ext(in_stack_00000018);
    GLAD_GL_EXT_primitive_bounding_box = has_ext(in_stack_00000018);
    GLAD_GL_EXT_protected_textures = has_ext(in_stack_00000018);
    GLAD_GL_EXT_pvrtc_sRGB = has_ext(in_stack_00000018);
    GLAD_GL_EXT_raster_multisample = has_ext(in_stack_00000018);
    GLAD_GL_EXT_read_format_bgra = has_ext(in_stack_00000018);
    GLAD_GL_EXT_render_snorm = has_ext(in_stack_00000018);
    GLAD_GL_EXT_robustness = has_ext(in_stack_00000018);
    GLAD_GL_EXT_sRGB = has_ext(in_stack_00000018);
    GLAD_GL_EXT_sRGB_write_control = has_ext(in_stack_00000018);
    GLAD_GL_EXT_semaphore = has_ext(in_stack_00000018);
    GLAD_GL_EXT_semaphore_fd = has_ext(in_stack_00000018);
    GLAD_GL_EXT_semaphore_win32 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_separate_shader_objects = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_framebuffer_fetch = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_group_vote = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_implicit_conversions = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_integer_mix = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_io_blocks = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_non_constant_global_initializers = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_pixel_local_storage = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_pixel_local_storage2 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shader_texture_lod = has_ext(in_stack_00000018);
    GLAD_GL_EXT_shadow_samplers = has_ext(in_stack_00000018);
    GLAD_GL_EXT_sparse_texture = has_ext(in_stack_00000018);
    GLAD_GL_EXT_sparse_texture2 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_tessellation_point_size = has_ext(in_stack_00000018);
    GLAD_GL_EXT_tessellation_shader = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_border_clamp = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_buffer = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_compression_astc_decode_mode = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_compression_dxt1 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_compression_s3tc = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_cube_map_array = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_filter_minmax = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_format_BGRA8888 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_norm16 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_rg = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_sRGB_R8 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_sRGB_RG8 = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_sRGB_decode = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_storage = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_type_2_10_10_10_REV = has_ext(in_stack_00000018);
    GLAD_GL_EXT_texture_view = has_ext(in_stack_00000018);
    GLAD_GL_EXT_unpack_subimage = has_ext(in_stack_00000018);
    GLAD_GL_EXT_win32_keyed_mutex = has_ext(in_stack_00000018);
    GLAD_GL_EXT_window_rectangles = has_ext(in_stack_00000018);
    GLAD_GL_FJ_shader_binary_GCCSO = has_ext(in_stack_00000018);
    GLAD_GL_IMG_bindless_texture = has_ext(in_stack_00000018);
    GLAD_GL_IMG_framebuffer_downsample = has_ext(in_stack_00000018);
    GLAD_GL_IMG_multisampled_render_to_texture = has_ext(in_stack_00000018);
    GLAD_GL_IMG_program_binary = has_ext(in_stack_00000018);
    GLAD_GL_IMG_read_format = has_ext(in_stack_00000018);
    GLAD_GL_IMG_shader_binary = has_ext(in_stack_00000018);
    GLAD_GL_IMG_texture_compression_pvrtc = has_ext(in_stack_00000018);
    GLAD_GL_IMG_texture_compression_pvrtc2 = has_ext(in_stack_00000018);
    GLAD_GL_IMG_texture_filter_cubic = has_ext(in_stack_00000018);
    GLAD_GL_INTEL_conservative_rasterization = has_ext(in_stack_00000018);
    GLAD_GL_INTEL_framebuffer_CMAA = has_ext(in_stack_00000018);
    GLAD_GL_INTEL_performance_query = has_ext(in_stack_00000018);
    GLAD_GL_KHR_blend_equation_advanced = has_ext(in_stack_00000018);
    GLAD_GL_KHR_blend_equation_advanced_coherent = has_ext(in_stack_00000018);
    GLAD_GL_KHR_context_flush_control = has_ext(in_stack_00000018);
    GLAD_GL_KHR_debug = has_ext(in_stack_00000018);
    GLAD_GL_KHR_no_error = has_ext(in_stack_00000018);
    GLAD_GL_KHR_robust_buffer_access_behavior = has_ext(in_stack_00000018);
    GLAD_GL_KHR_robustness = has_ext(in_stack_00000018);
    GLAD_GL_KHR_texture_compression_astc_hdr = has_ext(in_stack_00000018);
    GLAD_GL_KHR_texture_compression_astc_ldr = has_ext(in_stack_00000018);
    GLAD_GL_KHR_texture_compression_astc_sliced_3d = has_ext(in_stack_00000018);
    GLAD_GL_MESA_shader_integer_functions = has_ext(in_stack_00000018);
    GLAD_GL_NVX_blend_equation_advanced_multi_draw_buffers = has_ext(in_stack_00000018);
    GLAD_GL_NV_bindless_texture = has_ext(in_stack_00000018);
    GLAD_GL_NV_blend_equation_advanced = has_ext(in_stack_00000018);
    GLAD_GL_NV_blend_equation_advanced_coherent = has_ext(in_stack_00000018);
    GLAD_GL_NV_conditional_render = has_ext(in_stack_00000018);
    GLAD_GL_NV_conservative_raster = has_ext(in_stack_00000018);
    GLAD_GL_NV_conservative_raster_pre_snap_triangles = has_ext(in_stack_00000018);
    GLAD_GL_NV_copy_buffer = has_ext(in_stack_00000018);
    GLAD_GL_NV_coverage_sample = has_ext(in_stack_00000018);
    GLAD_GL_NV_depth_nonlinear = has_ext(in_stack_00000018);
    GLAD_GL_NV_draw_buffers = has_ext(in_stack_00000018);
    GLAD_GL_NV_draw_instanced = has_ext(in_stack_00000018);
    GLAD_GL_NV_draw_vulkan_image = has_ext(in_stack_00000018);
    GLAD_GL_NV_explicit_attrib_location = has_ext(in_stack_00000018);
    GLAD_GL_NV_fbo_color_attachments = has_ext(in_stack_00000018);
    GLAD_GL_NV_fence = has_ext(in_stack_00000018);
    GLAD_GL_NV_fill_rectangle = has_ext(in_stack_00000018);
    GLAD_GL_NV_fragment_coverage_to_color = has_ext(in_stack_00000018);
    GLAD_GL_NV_fragment_shader_interlock = has_ext(in_stack_00000018);
    GLAD_GL_NV_framebuffer_blit = has_ext(in_stack_00000018);
    GLAD_GL_NV_framebuffer_mixed_samples = has_ext(in_stack_00000018);
    GLAD_GL_NV_framebuffer_multisample = has_ext(in_stack_00000018);
    GLAD_GL_NV_generate_mipmap_sRGB = has_ext(in_stack_00000018);
    GLAD_GL_NV_geometry_shader_passthrough = has_ext(in_stack_00000018);
    GLAD_GL_NV_gpu_shader5 = has_ext(in_stack_00000018);
    GLAD_GL_NV_image_formats = has_ext(in_stack_00000018);
    GLAD_GL_NV_instanced_arrays = has_ext(in_stack_00000018);
    GLAD_GL_NV_internalformat_sample_query = has_ext(in_stack_00000018);
    GLAD_GL_NV_non_square_matrices = has_ext(in_stack_00000018);
    GLAD_GL_NV_path_rendering = has_ext(in_stack_00000018);
    GLAD_GL_NV_path_rendering_shared_edge = has_ext(in_stack_00000018);
    GLAD_GL_NV_polygon_mode = has_ext(in_stack_00000018);
    GLAD_GL_NV_read_buffer = has_ext(in_stack_00000018);
    GLAD_GL_NV_read_buffer_front = has_ext(in_stack_00000018);
    GLAD_GL_NV_read_depth = has_ext(in_stack_00000018);
    GLAD_GL_NV_read_depth_stencil = has_ext(in_stack_00000018);
    GLAD_GL_NV_read_stencil = has_ext(in_stack_00000018);
    GLAD_GL_NV_sRGB_formats = has_ext(in_stack_00000018);
    GLAD_GL_NV_sample_locations = has_ext(in_stack_00000018);
    GLAD_GL_NV_sample_mask_override_coverage = has_ext(in_stack_00000018);
    GLAD_GL_NV_shader_atomic_fp16_vector = has_ext(in_stack_00000018);
    GLAD_GL_NV_shader_noperspective_interpolation = has_ext(in_stack_00000018);
    GLAD_GL_NV_shadow_samplers_array = has_ext(in_stack_00000018);
    GLAD_GL_NV_shadow_samplers_cube = has_ext(in_stack_00000018);
    GLAD_GL_NV_texture_border_clamp = has_ext(in_stack_00000018);
    GLAD_GL_NV_texture_compression_s3tc_update = has_ext(in_stack_00000018);
    GLAD_GL_NV_texture_npot_2D_mipmap = has_ext(in_stack_00000018);
    GLAD_GL_NV_viewport_array = has_ext(in_stack_00000018);
    GLAD_GL_NV_viewport_array2 = has_ext(in_stack_00000018);
    GLAD_GL_NV_viewport_swizzle = has_ext(in_stack_00000018);
    GLAD_GL_OES_EGL_image = has_ext(in_stack_00000018);
    GLAD_GL_OES_EGL_image_external = has_ext(in_stack_00000018);
    GLAD_GL_OES_EGL_image_external_essl3 = has_ext(in_stack_00000018);
    GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext(in_stack_00000018);
    GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext(in_stack_00000018);
    GLAD_GL_OES_compressed_paletted_texture = has_ext(in_stack_00000018);
    GLAD_GL_OES_copy_image = has_ext(in_stack_00000018);
    GLAD_GL_OES_depth24 = has_ext(in_stack_00000018);
    GLAD_GL_OES_depth32 = has_ext(in_stack_00000018);
    GLAD_GL_OES_depth_texture = has_ext(in_stack_00000018);
    GLAD_GL_OES_draw_buffers_indexed = has_ext(in_stack_00000018);
    GLAD_GL_OES_draw_elements_base_vertex = has_ext(in_stack_00000018);
    GLAD_GL_OES_element_index_uint = has_ext(in_stack_00000018);
    GLAD_GL_OES_fbo_render_mipmap = has_ext(in_stack_00000018);
    GLAD_GL_OES_fragment_precision_high = has_ext(in_stack_00000018);
    GLAD_GL_OES_geometry_point_size = has_ext(in_stack_00000018);
    GLAD_GL_OES_geometry_shader = has_ext(in_stack_00000018);
    GLAD_GL_OES_get_program_binary = has_ext(in_stack_00000018);
    GLAD_GL_OES_gpu_shader5 = has_ext(in_stack_00000018);
    GLAD_GL_OES_mapbuffer = has_ext(in_stack_00000018);
    GLAD_GL_OES_packed_depth_stencil = has_ext(in_stack_00000018);
    GLAD_GL_OES_primitive_bounding_box = has_ext(in_stack_00000018);
    GLAD_GL_OES_required_internalformat = has_ext(in_stack_00000018);
    GLAD_GL_OES_rgb8_rgba8 = has_ext(in_stack_00000018);
    GLAD_GL_OES_sample_shading = has_ext(in_stack_00000018);
    GLAD_GL_OES_sample_variables = has_ext(in_stack_00000018);
    GLAD_GL_OES_shader_image_atomic = has_ext(in_stack_00000018);
    GLAD_GL_OES_shader_io_blocks = has_ext(in_stack_00000018);
    GLAD_GL_OES_shader_multisample_interpolation = has_ext(in_stack_00000018);
    GLAD_GL_OES_standard_derivatives = has_ext(in_stack_00000018);
    GLAD_GL_OES_stencil1 = has_ext(in_stack_00000018);
    GLAD_GL_OES_stencil4 = has_ext(in_stack_00000018);
    GLAD_GL_OES_surfaceless_context = has_ext(in_stack_00000018);
    GLAD_GL_OES_tessellation_point_size = has_ext(in_stack_00000018);
    GLAD_GL_OES_tessellation_shader = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_3D = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_border_clamp = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_buffer = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_compression_astc = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_cube_map_array = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_float = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_float_linear = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_half_float = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_half_float_linear = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_npot = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_stencil8 = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_storage_multisample_2d_array = has_ext(in_stack_00000018);
    GLAD_GL_OES_texture_view = has_ext(in_stack_00000018);
    GLAD_GL_OES_vertex_array_object = has_ext(in_stack_00000018);
    GLAD_GL_OES_vertex_half_float = has_ext(in_stack_00000018);
    GLAD_GL_OES_vertex_type_10_10_10_2 = has_ext(in_stack_00000018);
    GLAD_GL_OES_viewport_array = has_ext(in_stack_00000018);
    GLAD_GL_OVR_multiview = has_ext(in_stack_00000018);
    GLAD_GL_OVR_multiview2 = has_ext(in_stack_00000018);
    GLAD_GL_OVR_multiview_multisampled_render_to_texture = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_alpha_test = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_binning_control = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_driver_control = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_extended_get = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_extended_get2 = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_framebuffer_foveated = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_perfmon_global_mode = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_shader_framebuffer_fetch_noncoherent = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_tiled_rendering = has_ext(in_stack_00000018);
    GLAD_GL_QCOM_writeonly_rendering = has_ext(in_stack_00000018);
    GLAD_GL_VIV_shader_binary = has_ext(in_stack_00000018);
    free_exts();
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int find_extensionsGLES2(void) {
	if (!get_exts()) return 0;
	GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
	GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
	GLAD_GL_AMD_performance_monitor = has_ext("GL_AMD_performance_monitor");
	GLAD_GL_AMD_program_binary_Z400 = has_ext("GL_AMD_program_binary_Z400");
	GLAD_GL_ANDROID_extension_pack_es31a = has_ext("GL_ANDROID_extension_pack_es31a");
	GLAD_GL_ANGLE_depth_texture = has_ext("GL_ANGLE_depth_texture");
	GLAD_GL_ANGLE_framebuffer_blit = has_ext("GL_ANGLE_framebuffer_blit");
	GLAD_GL_ANGLE_framebuffer_multisample = has_ext("GL_ANGLE_framebuffer_multisample");
	GLAD_GL_ANGLE_instanced_arrays = has_ext("GL_ANGLE_instanced_arrays");
	GLAD_GL_ANGLE_pack_reverse_row_order = has_ext("GL_ANGLE_pack_reverse_row_order");
	GLAD_GL_ANGLE_program_binary = has_ext("GL_ANGLE_program_binary");
	GLAD_GL_ANGLE_texture_compression_dxt3 = has_ext("GL_ANGLE_texture_compression_dxt3");
	GLAD_GL_ANGLE_texture_compression_dxt5 = has_ext("GL_ANGLE_texture_compression_dxt5");
	GLAD_GL_ANGLE_texture_usage = has_ext("GL_ANGLE_texture_usage");
	GLAD_GL_ANGLE_translated_shader_source = has_ext("GL_ANGLE_translated_shader_source");
	GLAD_GL_APPLE_clip_distance = has_ext("GL_APPLE_clip_distance");
	GLAD_GL_APPLE_color_buffer_packed_float = has_ext("GL_APPLE_color_buffer_packed_float");
	GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
	GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
	GLAD_GL_APPLE_rgb_422 = has_ext("GL_APPLE_rgb_422");
	GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
	GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
	GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
	GLAD_GL_APPLE_texture_packed_float = has_ext("GL_APPLE_texture_packed_float");
	GLAD_GL_ARM_mali_program_binary = has_ext("GL_ARM_mali_program_binary");
	GLAD_GL_ARM_mali_shader_binary = has_ext("GL_ARM_mali_shader_binary");
	GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
	GLAD_GL_ARM_shader_framebuffer_fetch = has_ext("GL_ARM_shader_framebuffer_fetch");
	GLAD_GL_ARM_shader_framebuffer_fetch_depth_stencil = has_ext("GL_ARM_shader_framebuffer_fetch_depth_stencil");
	GLAD_GL_DMP_program_binary = has_ext("GL_DMP_program_binary");
	GLAD_GL_DMP_shader_binary = has_ext("GL_DMP_shader_binary");
	GLAD_GL_EXT_EGL_image_array = has_ext("GL_EXT_EGL_image_array");
	GLAD_GL_EXT_YUV_target = has_ext("GL_EXT_YUV_target");
	GLAD_GL_EXT_base_instance = has_ext("GL_EXT_base_instance");
	GLAD_GL_EXT_blend_func_extended = has_ext("GL_EXT_blend_func_extended");
	GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
	GLAD_GL_EXT_buffer_storage = has_ext("GL_EXT_buffer_storage");
	GLAD_GL_EXT_clear_texture = has_ext("GL_EXT_clear_texture");
	GLAD_GL_EXT_clip_cull_distance = has_ext("GL_EXT_clip_cull_distance");
	GLAD_GL_EXT_color_buffer_float = has_ext("GL_EXT_color_buffer_float");
	GLAD_GL_EXT_color_buffer_half_float = has_ext("GL_EXT_color_buffer_half_float");
	GLAD_GL_EXT_conservative_depth = has_ext("GL_EXT_conservative_depth");
	GLAD_GL_EXT_copy_image = has_ext("GL_EXT_copy_image");
	GLAD_GL_EXT_debug_label = has_ext("GL_EXT_debug_label");
	GLAD_GL_EXT_debug_marker = has_ext("GL_EXT_debug_marker");
	GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
	GLAD_GL_EXT_disjoint_timer_query = has_ext("GL_EXT_disjoint_timer_query");
	GLAD_GL_EXT_draw_buffers = has_ext("GL_EXT_draw_buffers");
	GLAD_GL_EXT_draw_buffers_indexed = has_ext("GL_EXT_draw_buffers_indexed");
	GLAD_GL_EXT_draw_elements_base_vertex = has_ext("GL_EXT_draw_elements_base_vertex");
	GLAD_GL_EXT_draw_instanced = has_ext("GL_EXT_draw_instanced");
	GLAD_GL_EXT_draw_transform_feedback = has_ext("GL_EXT_draw_transform_feedback");
	GLAD_GL_EXT_external_buffer = has_ext("GL_EXT_external_buffer");
	GLAD_GL_EXT_float_blend = has_ext("GL_EXT_float_blend");
	GLAD_GL_EXT_geometry_point_size = has_ext("GL_EXT_geometry_point_size");
	GLAD_GL_EXT_geometry_shader = has_ext("GL_EXT_geometry_shader");
	GLAD_GL_EXT_gpu_shader5 = has_ext("GL_EXT_gpu_shader5");
	GLAD_GL_EXT_instanced_arrays = has_ext("GL_EXT_instanced_arrays");
	GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
	GLAD_GL_EXT_memory_object = has_ext("GL_EXT_memory_object");
	GLAD_GL_EXT_memory_object_fd = has_ext("GL_EXT_memory_object_fd");
	GLAD_GL_EXT_memory_object_win32 = has_ext("GL_EXT_memory_object_win32");
	GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
	GLAD_GL_EXT_multi_draw_indirect = has_ext("GL_EXT_multi_draw_indirect");
	GLAD_GL_EXT_multisampled_compatibility = has_ext("GL_EXT_multisampled_compatibility");
	GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
	GLAD_GL_EXT_multiview_draw_buffers = has_ext("GL_EXT_multiview_draw_buffers");
	GLAD_GL_EXT_occlusion_query_boolean = has_ext("GL_EXT_occlusion_query_boolean");
	GLAD_GL_EXT_polygon_offset_clamp = has_ext("GL_EXT_polygon_offset_clamp");
	GLAD_GL_EXT_post_depth_coverage = has_ext("GL_EXT_post_depth_coverage");
	GLAD_GL_EXT_primitive_bounding_box = has_ext("GL_EXT_primitive_bounding_box");
	GLAD_GL_EXT_protected_textures = has_ext("GL_EXT_protected_textures");
	GLAD_GL_EXT_pvrtc_sRGB = has_ext("GL_EXT_pvrtc_sRGB");
	GLAD_GL_EXT_raster_multisample = has_ext("GL_EXT_raster_multisample");
	GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
	GLAD_GL_EXT_render_snorm = has_ext("GL_EXT_render_snorm");
	GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
	GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
	GLAD_GL_EXT_sRGB_write_control = has_ext("GL_EXT_sRGB_write_control");
	GLAD_GL_EXT_semaphore = has_ext("GL_EXT_semaphore");
	GLAD_GL_EXT_semaphore_fd = has_ext("GL_EXT_semaphore_fd");
	GLAD_GL_EXT_semaphore_win32 = has_ext("GL_EXT_semaphore_win32");
	GLAD_GL_EXT_separate_shader_objects = has_ext("GL_EXT_separate_shader_objects");
	GLAD_GL_EXT_shader_framebuffer_fetch = has_ext("GL_EXT_shader_framebuffer_fetch");
	GLAD_GL_EXT_shader_group_vote = has_ext("GL_EXT_shader_group_vote");
	GLAD_GL_EXT_shader_implicit_conversions = has_ext("GL_EXT_shader_implicit_conversions");
	GLAD_GL_EXT_shader_integer_mix = has_ext("GL_EXT_shader_integer_mix");
	GLAD_GL_EXT_shader_io_blocks = has_ext("GL_EXT_shader_io_blocks");
	GLAD_GL_EXT_shader_non_constant_global_initializers = has_ext("GL_EXT_shader_non_constant_global_initializers");
	GLAD_GL_EXT_shader_pixel_local_storage = has_ext("GL_EXT_shader_pixel_local_storage");
	GLAD_GL_EXT_shader_pixel_local_storage2 = has_ext("GL_EXT_shader_pixel_local_storage2");
	GLAD_GL_EXT_shader_texture_lod = has_ext("GL_EXT_shader_texture_lod");
	GLAD_GL_EXT_shadow_samplers = has_ext("GL_EXT_shadow_samplers");
	GLAD_GL_EXT_sparse_texture = has_ext("GL_EXT_sparse_texture");
	GLAD_GL_EXT_sparse_texture2 = has_ext("GL_EXT_sparse_texture2");
	GLAD_GL_EXT_tessellation_point_size = has_ext("GL_EXT_tessellation_point_size");
	GLAD_GL_EXT_tessellation_shader = has_ext("GL_EXT_tessellation_shader");
	GLAD_GL_EXT_texture_border_clamp = has_ext("GL_EXT_texture_border_clamp");
	GLAD_GL_EXT_texture_buffer = has_ext("GL_EXT_texture_buffer");
	GLAD_GL_EXT_texture_compression_astc_decode_mode = has_ext("GL_EXT_texture_compression_astc_decode_mode");
	GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
	GLAD_GL_EXT_texture_compression_s3tc = has_ext("GL_EXT_texture_compression_s3tc");
	GLAD_GL_EXT_texture_cube_map_array = has_ext("GL_EXT_texture_cube_map_array");
	GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
	GLAD_GL_EXT_texture_filter_minmax = has_ext("GL_EXT_texture_filter_minmax");
	GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
	GLAD_GL_EXT_texture_norm16 = has_ext("GL_EXT_texture_norm16");
	GLAD_GL_EXT_texture_rg = has_ext("GL_EXT_texture_rg");
	GLAD_GL_EXT_texture_sRGB_R8 = has_ext("GL_EXT_texture_sRGB_R8");
	GLAD_GL_EXT_texture_sRGB_RG8 = has_ext("GL_EXT_texture_sRGB_RG8");
	GLAD_GL_EXT_texture_sRGB_decode = has_ext("GL_EXT_texture_sRGB_decode");
	GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
	GLAD_GL_EXT_texture_type_2_10_10_10_REV = has_ext("GL_EXT_texture_type_2_10_10_10_REV");
	GLAD_GL_EXT_texture_view = has_ext("GL_EXT_texture_view");
	GLAD_GL_EXT_unpack_subimage = has_ext("GL_EXT_unpack_subimage");
	GLAD_GL_EXT_win32_keyed_mutex = has_ext("GL_EXT_win32_keyed_mutex");
	GLAD_GL_EXT_window_rectangles = has_ext("GL_EXT_window_rectangles");
	GLAD_GL_FJ_shader_binary_GCCSO = has_ext("GL_FJ_shader_binary_GCCSO");
	GLAD_GL_IMG_bindless_texture = has_ext("GL_IMG_bindless_texture");
	GLAD_GL_IMG_framebuffer_downsample = has_ext("GL_IMG_framebuffer_downsample");
	GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
	GLAD_GL_IMG_program_binary = has_ext("GL_IMG_program_binary");
	GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
	GLAD_GL_IMG_shader_binary = has_ext("GL_IMG_shader_binary");
	GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
	GLAD_GL_IMG_texture_compression_pvrtc2 = has_ext("GL_IMG_texture_compression_pvrtc2");
	GLAD_GL_IMG_texture_filter_cubic = has_ext("GL_IMG_texture_filter_cubic");
	GLAD_GL_INTEL_conservative_rasterization = has_ext("GL_INTEL_conservative_rasterization");
	GLAD_GL_INTEL_framebuffer_CMAA = has_ext("GL_INTEL_framebuffer_CMAA");
	GLAD_GL_INTEL_performance_query = has_ext("GL_INTEL_performance_query");
	GLAD_GL_KHR_blend_equation_advanced = has_ext("GL_KHR_blend_equation_advanced");
	GLAD_GL_KHR_blend_equation_advanced_coherent = has_ext("GL_KHR_blend_equation_advanced_coherent");
	GLAD_GL_KHR_context_flush_control = has_ext("GL_KHR_context_flush_control");
	GLAD_GL_KHR_debug = has_ext("GL_KHR_debug");
	GLAD_GL_KHR_no_error = has_ext("GL_KHR_no_error");
	GLAD_GL_KHR_robust_buffer_access_behavior = has_ext("GL_KHR_robust_buffer_access_behavior");
	GLAD_GL_KHR_robustness = has_ext("GL_KHR_robustness");
	GLAD_GL_KHR_texture_compression_astc_hdr = has_ext("GL_KHR_texture_compression_astc_hdr");
	GLAD_GL_KHR_texture_compression_astc_ldr = has_ext("GL_KHR_texture_compression_astc_ldr");
	GLAD_GL_KHR_texture_compression_astc_sliced_3d = has_ext("GL_KHR_texture_compression_astc_sliced_3d");
	GLAD_GL_MESA_shader_integer_functions = has_ext("GL_MESA_shader_integer_functions");
	GLAD_GL_NVX_blend_equation_advanced_multi_draw_buffers = has_ext("GL_NVX_blend_equation_advanced_multi_draw_buffers");
	GLAD_GL_NV_bindless_texture = has_ext("GL_NV_bindless_texture");
	GLAD_GL_NV_blend_equation_advanced = has_ext("GL_NV_blend_equation_advanced");
	GLAD_GL_NV_blend_equation_advanced_coherent = has_ext("GL_NV_blend_equation_advanced_coherent");
	GLAD_GL_NV_conditional_render = has_ext("GL_NV_conditional_render");
	GLAD_GL_NV_conservative_raster = has_ext("GL_NV_conservative_raster");
	GLAD_GL_NV_conservative_raster_pre_snap_triangles = has_ext("GL_NV_conservative_raster_pre_snap_triangles");
	GLAD_GL_NV_copy_buffer = has_ext("GL_NV_copy_buffer");
	GLAD_GL_NV_coverage_sample = has_ext("GL_NV_coverage_sample");
	GLAD_GL_NV_depth_nonlinear = has_ext("GL_NV_depth_nonlinear");
	GLAD_GL_NV_draw_buffers = has_ext("GL_NV_draw_buffers");
	GLAD_GL_NV_draw_instanced = has_ext("GL_NV_draw_instanced");
	GLAD_GL_NV_draw_vulkan_image = has_ext("GL_NV_draw_vulkan_image");
	GLAD_GL_NV_explicit_attrib_location = has_ext("GL_NV_explicit_attrib_location");
	GLAD_GL_NV_fbo_color_attachments = has_ext("GL_NV_fbo_color_attachments");
	GLAD_GL_NV_fence = has_ext("GL_NV_fence");
	GLAD_GL_NV_fill_rectangle = has_ext("GL_NV_fill_rectangle");
	GLAD_GL_NV_fragment_coverage_to_color = has_ext("GL_NV_fragment_coverage_to_color");
	GLAD_GL_NV_fragment_shader_interlock = has_ext("GL_NV_fragment_shader_interlock");
	GLAD_GL_NV_framebuffer_blit = has_ext("GL_NV_framebuffer_blit");
	GLAD_GL_NV_framebuffer_mixed_samples = has_ext("GL_NV_framebuffer_mixed_samples");
	GLAD_GL_NV_framebuffer_multisample = has_ext("GL_NV_framebuffer_multisample");
	GLAD_GL_NV_generate_mipmap_sRGB = has_ext("GL_NV_generate_mipmap_sRGB");
	GLAD_GL_NV_geometry_shader_passthrough = has_ext("GL_NV_geometry_shader_passthrough");
	GLAD_GL_NV_gpu_shader5 = has_ext("GL_NV_gpu_shader5");
	GLAD_GL_NV_image_formats = has_ext("GL_NV_image_formats");
	GLAD_GL_NV_instanced_arrays = has_ext("GL_NV_instanced_arrays");
	GLAD_GL_NV_internalformat_sample_query = has_ext("GL_NV_internalformat_sample_query");
	GLAD_GL_NV_non_square_matrices = has_ext("GL_NV_non_square_matrices");
	GLAD_GL_NV_path_rendering = has_ext("GL_NV_path_rendering");
	GLAD_GL_NV_path_rendering_shared_edge = has_ext("GL_NV_path_rendering_shared_edge");
	GLAD_GL_NV_polygon_mode = has_ext("GL_NV_polygon_mode");
	GLAD_GL_NV_read_buffer = has_ext("GL_NV_read_buffer");
	GLAD_GL_NV_read_buffer_front = has_ext("GL_NV_read_buffer_front");
	GLAD_GL_NV_read_depth = has_ext("GL_NV_read_depth");
	GLAD_GL_NV_read_depth_stencil = has_ext("GL_NV_read_depth_stencil");
	GLAD_GL_NV_read_stencil = has_ext("GL_NV_read_stencil");
	GLAD_GL_NV_sRGB_formats = has_ext("GL_NV_sRGB_formats");
	GLAD_GL_NV_sample_locations = has_ext("GL_NV_sample_locations");
	GLAD_GL_NV_sample_mask_override_coverage = has_ext("GL_NV_sample_mask_override_coverage");
	GLAD_GL_NV_shader_atomic_fp16_vector = has_ext("GL_NV_shader_atomic_fp16_vector");
	GLAD_GL_NV_shader_noperspective_interpolation = has_ext("GL_NV_shader_noperspective_interpolation");
	GLAD_GL_NV_shadow_samplers_array = has_ext("GL_NV_shadow_samplers_array");
	GLAD_GL_NV_shadow_samplers_cube = has_ext("GL_NV_shadow_samplers_cube");
	GLAD_GL_NV_texture_border_clamp = has_ext("GL_NV_texture_border_clamp");
	GLAD_GL_NV_texture_compression_s3tc_update = has_ext("GL_NV_texture_compression_s3tc_update");
	GLAD_GL_NV_texture_npot_2D_mipmap = has_ext("GL_NV_texture_npot_2D_mipmap");
	GLAD_GL_NV_viewport_array = has_ext("GL_NV_viewport_array");
	GLAD_GL_NV_viewport_array2 = has_ext("GL_NV_viewport_array2");
	GLAD_GL_NV_viewport_swizzle = has_ext("GL_NV_viewport_swizzle");
	GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
	GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
	GLAD_GL_OES_EGL_image_external_essl3 = has_ext("GL_OES_EGL_image_external_essl3");
	GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
	GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
	GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
	GLAD_GL_OES_copy_image = has_ext("GL_OES_copy_image");
	GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
	GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
	GLAD_GL_OES_depth_texture = has_ext("GL_OES_depth_texture");
	GLAD_GL_OES_draw_buffers_indexed = has_ext("GL_OES_draw_buffers_indexed");
	GLAD_GL_OES_draw_elements_base_vertex = has_ext("GL_OES_draw_elements_base_vertex");
	GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
	GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
	GLAD_GL_OES_fragment_precision_high = has_ext("GL_OES_fragment_precision_high");
	GLAD_GL_OES_geometry_point_size = has_ext("GL_OES_geometry_point_size");
	GLAD_GL_OES_geometry_shader = has_ext("GL_OES_geometry_shader");
	GLAD_GL_OES_get_program_binary = has_ext("GL_OES_get_program_binary");
	GLAD_GL_OES_gpu_shader5 = has_ext("GL_OES_gpu_shader5");
	GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
	GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
	GLAD_GL_OES_primitive_bounding_box = has_ext("GL_OES_primitive_bounding_box");
	GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
	GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
	GLAD_GL_OES_sample_shading = has_ext("GL_OES_sample_shading");
	GLAD_GL_OES_sample_variables = has_ext("GL_OES_sample_variables");
	GLAD_GL_OES_shader_image_atomic = has_ext("GL_OES_shader_image_atomic");
	GLAD_GL_OES_shader_io_blocks = has_ext("GL_OES_shader_io_blocks");
	GLAD_GL_OES_shader_multisample_interpolation = has_ext("GL_OES_shader_multisample_interpolation");
	GLAD_GL_OES_standard_derivatives = has_ext("GL_OES_standard_derivatives");
	GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
	GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
	GLAD_GL_OES_surfaceless_context = has_ext("GL_OES_surfaceless_context");
	GLAD_GL_OES_tessellation_point_size = has_ext("GL_OES_tessellation_point_size");
	GLAD_GL_OES_tessellation_shader = has_ext("GL_OES_tessellation_shader");
	GLAD_GL_OES_texture_3D = has_ext("GL_OES_texture_3D");
	GLAD_GL_OES_texture_border_clamp = has_ext("GL_OES_texture_border_clamp");
	GLAD_GL_OES_texture_buffer = has_ext("GL_OES_texture_buffer");
	GLAD_GL_OES_texture_compression_astc = has_ext("GL_OES_texture_compression_astc");
	GLAD_GL_OES_texture_cube_map_array = has_ext("GL_OES_texture_cube_map_array");
	GLAD_GL_OES_texture_float = has_ext("GL_OES_texture_float");
	GLAD_GL_OES_texture_float_linear = has_ext("GL_OES_texture_float_linear");
	GLAD_GL_OES_texture_half_float = has_ext("GL_OES_texture_half_float");
	GLAD_GL_OES_texture_half_float_linear = has_ext("GL_OES_texture_half_float_linear");
	GLAD_GL_OES_texture_npot = has_ext("GL_OES_texture_npot");
	GLAD_GL_OES_texture_stencil8 = has_ext("GL_OES_texture_stencil8");
	GLAD_GL_OES_texture_storage_multisample_2d_array = has_ext("GL_OES_texture_storage_multisample_2d_array");
	GLAD_GL_OES_texture_view = has_ext("GL_OES_texture_view");
	GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
	GLAD_GL_OES_vertex_half_float = has_ext("GL_OES_vertex_half_float");
	GLAD_GL_OES_vertex_type_10_10_10_2 = has_ext("GL_OES_vertex_type_10_10_10_2");
	GLAD_GL_OES_viewport_array = has_ext("GL_OES_viewport_array");
	GLAD_GL_OVR_multiview = has_ext("GL_OVR_multiview");
	GLAD_GL_OVR_multiview2 = has_ext("GL_OVR_multiview2");
	GLAD_GL_OVR_multiview_multisampled_render_to_texture = has_ext("GL_OVR_multiview_multisampled_render_to_texture");
	GLAD_GL_QCOM_alpha_test = has_ext("GL_QCOM_alpha_test");
	GLAD_GL_QCOM_binning_control = has_ext("GL_QCOM_binning_control");
	GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
	GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
	GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
	GLAD_GL_QCOM_framebuffer_foveated = has_ext("GL_QCOM_framebuffer_foveated");
	GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
	GLAD_GL_QCOM_shader_framebuffer_fetch_noncoherent = has_ext("GL_QCOM_shader_framebuffer_fetch_noncoherent");
	GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
	GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
	GLAD_GL_VIV_shader_binary = has_ext("GL_VIV_shader_binary");
	free_exts();
	return 1;
}